

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O2

ArrayElement * __thiscall
soul::Optimisations::Inliner::cloneArrayElement(Inliner *this,ArrayElement *old)

{
  Module *this_00;
  Expression *args_1;
  ArrayElement *pAVar1;
  Module *local_28;
  
  this_00 = this->module;
  args_1 = cloneExpression(this,(old->parent).object);
  pAVar1 = Module::
           allocate<soul::heart::ArrayElement,soul::CodeLocation_const&,soul::heart::Expression&,unsigned_long_const&,unsigned_long_const&>
                     (this_00,&(old->super_Expression).super_Object.location,args_1,
                      &old->fixedStartIndex,&old->fixedEndIndex);
  cloneExpressionPtr((Inliner *)&stack0xffffffffffffffd8,(pool_ptr<soul::heart::Expression> *)this);
  (pAVar1->dynamicIndex).object = (Expression *)local_28;
  pAVar1->suppressWrapWarning = old->suppressWrapWarning;
  pAVar1->isRangeTrusted = old->isRangeTrusted;
  return pAVar1;
}

Assistant:

heart::ArrayElement& cloneArrayElement (const heart::ArrayElement& old)
        {
            auto& s = module.allocate<heart::ArrayElement> (old.location,
                                                            cloneExpression (old.parent),
                                                            old.fixedStartIndex,
                                                            old.fixedEndIndex);

            s.dynamicIndex = cloneExpressionPtr (old.dynamicIndex);
            s.suppressWrapWarning = old.suppressWrapWarning;
            s.isRangeTrusted = old.isRangeTrusted;
            return s;
        }